

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Allocator *pAVar6;
  float *pfVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  long lVar11;
  Mat *pMVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  pointer piVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  void *pvVar20;
  int iVar21;
  int iVar22;
  void *pvVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  Allocator *pAVar28;
  pointer piVar29;
  long lVar30;
  ulong uVar31;
  pointer piVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  uint uVar39;
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  int iVar45;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  undefined1 local_148 [31];
  allocator_type local_129;
  int size_3;
  Mat *local_120;
  void *local_118;
  ulong local_110;
  ulong local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  vector<int,_std::allocator<int>_> _space_ofs;
  int remain;
  
  uVar3 = bottom_blob->w;
  uVar4 = bottom_blob->h;
  uVar5 = bottom_blob->c;
  uVar19 = bottom_blob->elemsize;
  iVar34 = (this->kernel_w + -1) * this->dilation_w + (uVar3 - 1) * this->stride_w + 1;
  uVar16 = (uVar4 - 1) * this->stride_h + (this->kernel_h + -1) * this->dilation_h + 1;
  _size_3 = (ulong)uVar16;
  local_178._16_8_ = 0;
  local_178._24_4_ = 0;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_4_ = 0;
  local_178._12_4_ = 0;
  local_158 = (undefined1  [16])0x0;
  local_148._0_16_ = (undefined1  [16])0x0;
  local_120 = top_blob;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    if ((Mat *)local_178 == top_blob) {
      local_118 = (void *)0x0;
      bVar38 = true;
      piVar18 = (int *)0x0;
      pAVar28 = (Allocator *)0x0;
      bVar37 = false;
      iVar24 = 0;
      uVar27 = 0;
      iVar17 = 0;
      bVar36 = false;
    }
    else {
      piVar18 = top_blob->refcount;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      local_178._0_8_ = top_blob->data;
      piVar18 = top_blob->refcount;
      local_178._8_4_ = SUB84(piVar18,0);
      local_178._12_4_ = (undefined4)((ulong)piVar18 >> 0x20);
      local_178._16_8_ = top_blob->elemsize;
      local_178._24_4_ = top_blob->packing;
      pAVar28 = top_blob->allocator;
      iVar17 = top_blob->w;
      local_158._0_8_ = top_blob->allocator;
      local_158._8_4_ = top_blob->dims;
      local_158._12_4_ = top_blob->w;
      uVar27 = top_blob->h;
      iVar24 = top_blob->c;
      local_118 = (void *)top_blob->cstep;
      local_148._0_4_ = top_blob->h;
      local_148._4_4_ = top_blob->c;
      local_148._8_8_ = top_blob->cstep;
      bVar36 = top_blob->dims == 3;
      bVar37 = local_178._24_4_ == 1;
      bVar38 = (pointer)local_178._0_8_ == (pointer)0x0;
    }
    iVar45 = this->num_output;
    pAVar6 = opt->blob_allocator;
    if ((bool)(local_178._16_8_ == uVar19 & bVar37 &
               (iVar24 == iVar45 && uVar27 == uVar16) & iVar17 == iVar34 & bVar36 &
              pAVar28 == pAVar6)) {
      iVar17 = -100;
      pvVar23 = local_118;
      if (!bVar38) goto LAB_00137094;
    }
    else {
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if ((Allocator *)local_158._0_8_ == (Allocator *)0x0) {
            if ((pointer)local_178._0_8_ != (pointer)0x0) {
              free((void *)local_178._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_158._0_8_ + 0x18))();
          }
        }
      }
      local_178._0_8_ = (void *)0x0;
      local_178._8_4_ = 0;
      local_178._12_4_ = 0;
      local_178._24_4_ = 1;
      local_158._8_4_ = 3;
      local_158._0_8_ = pAVar6;
      local_158._12_4_ = iVar34;
      local_148._4_4_ = iVar45;
      local_148._0_4_ = (int)_size_3;
      local_148._8_8_ = ((long)((int)_size_3 * iVar34) * uVar19 + 0xf & 0xfffffffffffffff0) / uVar19
      ;
      lVar33 = (long)iVar45 * local_148._8_8_;
      if (lVar33 == 0) {
        return -100;
      }
      uVar31 = lVar33 * uVar19 + 3 & 0xfffffffffffffffc;
      if (pAVar6 == (Allocator *)0x0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_178._16_8_ = uVar19;
        iVar17 = posix_memalign((void **)&_space_ofs,0x10,uVar31 + 4);
        local_178._0_8_ = (pointer)0x0;
        if (iVar17 == 0) {
          local_178._0_8_ =
               _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
      else {
        local_178._16_8_ = uVar19;
        local_178._0_8_ = (**(code **)(*(long *)pAVar6 + 0x10))(pAVar6,uVar31 + 4);
      }
      piVar18 = (int *)(uVar31 + local_178._0_8_);
      *(undefined4 *)(local_178._0_8_ + uVar31) = 1;
      pvVar23 = (void *)local_148._8_8_;
      iVar24 = local_148._4_4_;
      local_178._8_8_ = piVar18;
LAB_00137094:
      if ((long)iVar24 * (long)pvVar23 != 0) goto LAB_001370a4;
      iVar17 = -100;
    }
  }
  else {
    local_158._0_8_ = opt->workspace_allocator;
    local_178._0_8_ = (void *)0x0;
    local_178._8_4_ = 0;
    local_178._12_4_ = 0;
    local_178._24_4_ = 1;
    local_158._8_4_ = 3;
    local_158._12_4_ = iVar34;
    local_148._4_4_ = this->num_output;
    local_148._0_4_ = uVar16;
    local_148._8_8_ = ((long)(int)(uVar16 * iVar34) * uVar19 + 0xf & 0xfffffffffffffff0) / uVar19;
    lVar33 = local_148._8_8_ * (long)this->num_output;
    if (lVar33 == 0) {
      return -100;
    }
    uVar31 = lVar33 * uVar19 + 3 & 0xfffffffffffffffc;
    if ((Allocator *)local_158._0_8_ == (Allocator *)0x0) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_178._16_8_ = uVar19;
      iVar17 = posix_memalign((void **)&_space_ofs,0x10,uVar31 + 4);
      local_178._0_8_ = (pointer)0x0;
      if (iVar17 == 0) {
        local_178._0_8_ =
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    else {
      local_178._16_8_ = uVar19;
      local_178._0_8_ = (**(code **)(*(long *)local_158._0_8_ + 0x10))(local_158._0_8_,uVar31 + 4);
    }
    piVar18 = (int *)(local_178._0_8_ + uVar31);
    *(undefined4 *)(local_178._0_8_ + uVar31) = 1;
    local_178._8_8_ = piVar18;
    if ((long)(int)local_148._4_4_ * local_148._8_8_ == 0) {
      iVar17 = -100;
      goto LAB_00137780;
    }
LAB_001370a4:
    uVar16 = this->kernel_w * this->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar16,&local_129);
    piVar15 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = local_178._16_8_;
    uVar13 = local_178._0_8_;
    iVar17 = this->kernel_h;
    if (0 < iVar17) {
      iVar24 = this->dilation_h;
      iVar45 = this->kernel_w;
      iVar21 = this->dilation_w * iVar45;
      iVar22 = 0;
      iVar25 = 0;
      iVar26 = 0;
      do {
        if (0 < iVar45) {
          lVar33 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar22 + lVar33] = iVar25;
            iVar25 = iVar25 + this->dilation_w;
            iVar45 = this->kernel_w;
            lVar33 = lVar33 + 1;
          } while ((int)lVar33 < iVar45);
          iVar22 = iVar22 + (int)lVar33;
          iVar17 = this->kernel_h;
        }
        iVar25 = iVar25 + (iVar24 * iVar34 - iVar21);
        iVar26 = iVar26 + 1;
      } while (iVar26 < iVar17);
    }
    iVar17 = this->num_output;
    if (0 < (long)iVar17) {
      lVar30 = local_148._8_8_ * local_178._16_8_;
      local_100 = local_158._12_4_;
      uVar27 = local_148._0_4_ * local_158._12_4_;
      local_f8 = this->bias_term;
      iVar24 = this->activation_type;
      pvVar23 = (this->bias_data).data;
      _size_3 = (ulong)(uint)((int)_size_3 * iVar34);
      pfVar7 = (float *)(this->activation_params).data;
      lVar33 = (ulong)uVar27 - 1;
      auVar44._8_4_ = (int)lVar33;
      auVar44._0_8_ = lVar33;
      auVar44._12_4_ = (int)((ulong)lVar33 >> 0x20);
      piVar29 = (pointer)(local_178._0_8_ + 0xc);
      local_fc = uVar5 * uVar16;
      local_110 = 0;
      auVar44 = auVar44 ^ _DAT_00162c50;
      lVar33 = 0;
      piVar32 = (pointer)local_178._0_8_;
      auVar46 = _DAT_00163370;
      auVar47 = _DAT_00163380;
      auVar48 = _DAT_00162c50;
      do {
        iVar34 = 0;
        if (local_f8 != 0) {
          iVar34 = *(int *)((long)pvVar23 + lVar33 * 4);
        }
        if (0 < (int)uVar27) {
          uVar19 = 0;
          do {
            auVar41._8_4_ = (int)uVar19;
            auVar41._0_8_ = uVar19;
            auVar41._12_4_ = (int)(uVar19 >> 0x20);
            auVar43 = (auVar41 | auVar47) ^ auVar48;
            iVar45 = auVar44._4_4_;
            if ((bool)(~(iVar45 < auVar43._4_4_ ||
                        auVar44._0_4_ < auVar43._0_4_ && auVar43._4_4_ == iVar45) & 1)) {
              piVar29[uVar19 - 3] = iVar34;
            }
            if (auVar43._12_4_ <= auVar44._12_4_ &&
                (auVar43._8_4_ <= auVar44._8_4_ || auVar43._12_4_ != auVar44._12_4_)) {
              piVar29[uVar19 - 2] = iVar34;
            }
            auVar41 = (auVar41 | auVar46) ^ auVar48;
            iVar21 = auVar41._4_4_;
            if (iVar21 <= iVar45 && (iVar21 != iVar45 || auVar41._0_4_ <= auVar44._0_4_)) {
              piVar29[uVar19 - 1] = iVar34;
              piVar29[uVar19] = iVar34;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar27 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar4) {
          local_f4 = this->stride_h * local_100;
          iVar34 = this->stride_w;
          local_118 = (void *)((long)(int)local_110 * 4 + (long)(this->weight_data).data);
          local_108 = 0;
          do {
            if (0 < (int)uVar3) {
              iVar45 = bottom_blob->w;
              sVar8 = bottom_blob->elemsize;
              sVar9 = bottom_blob->cstep;
              pvVar10 = bottom_blob->data;
              uVar19 = 0;
              do {
                if (0 < (int)uVar5) {
                  lVar11 = uVar19 * (long)iVar34 * 4 +
                           (long)(local_f4 * (int)local_108) * uVar14 + lVar30 * lVar33;
                  uVar31 = 0;
                  pvVar20 = local_118;
                  do {
                    if (0 < (int)uVar16) {
                      fVar40 = *(float *)((long)pvVar10 +
                                         sVar9 * sVar8 * uVar31 +
                                         uVar19 * 4 + (long)iVar45 * local_108 * sVar8);
                      uVar35 = 0;
                      do {
                        *(float *)(uVar13 + (long)piVar15[uVar35] * 4 + lVar11) =
                             *(float *)((long)pvVar20 + uVar35 * 4) * fVar40 +
                             *(float *)(uVar13 + (long)piVar15[uVar35] * 4 + lVar11);
                        uVar35 = uVar35 + 1;
                      } while (uVar16 != uVar35);
                    }
                    uVar31 = uVar31 + 1;
                    pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar16 * 4);
                  } while (uVar31 != uVar5);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar3);
            }
            local_108 = local_108 + 1;
          } while (local_108 != uVar4);
        }
        iVar34 = (int)_size_3;
        switch(iVar24) {
        case 1:
          if (0 < iVar34) {
            uVar19 = 0;
            do {
              fVar40 = (float)piVar32[uVar19];
              if (fVar40 <= 0.0) {
                fVar40 = 0.0;
              }
              piVar32[uVar19] = (int)fVar40;
              uVar19 = uVar19 + 1;
            } while (_size_3 != uVar19);
          }
          break;
        case 2:
          if (0 < iVar34) {
            fVar40 = *pfVar7;
            uVar19 = 0;
            do {
              uVar39 = -(uint)(0.0 < (float)piVar32[uVar19]);
              piVar32[uVar19] =
                   (int)((float)(~uVar39 & (uint)fVar40 | uVar39 & 0x3f800000) *
                        (float)piVar32[uVar19]);
              uVar19 = uVar19 + 1;
            } while (_size_3 != uVar19);
          }
          break;
        case 3:
          if (0 < iVar34) {
            fVar40 = *pfVar7;
            fVar1 = pfVar7[1];
            uVar19 = 0;
            do {
              fVar2 = (float)piVar32[uVar19];
              fVar42 = fVar2;
              if (fVar2 <= fVar40) {
                fVar42 = fVar40;
              }
              if ((fVar2 < fVar40) || (fVar1 < fVar42)) {
                if (fVar1 <= fVar42) {
                  fVar42 = fVar1;
                }
                piVar32[uVar19] = (int)fVar42;
              }
              uVar19 = uVar19 + 1;
            } while (_size_3 != uVar19);
          }
          break;
        case 4:
          if (0 < iVar34) {
            uVar19 = 0;
            do {
              fVar40 = expf((float)(piVar32[uVar19] ^ auVar48._0_4_));
              auVar47 = _DAT_00163380;
              auVar46 = _DAT_00163370;
              auVar48 = _DAT_00162c50;
              piVar32[uVar19] = (int)(1.0 / (fVar40 + 1.0));
              uVar19 = uVar19 + 1;
            } while (_size_3 != uVar19);
          }
        }
        lVar33 = lVar33 + 1;
        piVar29 = (pointer)((long)piVar29 + lVar30);
        local_110 = (ulong)(uint)((int)local_110 + local_fc);
        piVar32 = (pointer)((long)piVar32 + lVar30);
      } while (lVar33 != iVar17);
    }
    pMVar12 = local_120;
    iVar34 = this->pad_w;
    iVar17 = this->pad_h;
    if (iVar17 < 1 && iVar34 < 1) {
      if ((Mat *)local_178 != local_120) {
        if ((int *)local_178._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_178._8_8_ = *(int *)local_178._8_8_ + 1;
          UNLOCK();
        }
        piVar18 = local_120->refcount;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (local_120->allocator == (Allocator *)0x0) {
              if (local_120->data != (void *)0x0) {
                free(local_120->data);
              }
            }
            else {
              (**(code **)(*(long *)local_120->allocator + 0x18))();
            }
          }
        }
        auVar46 = local_148._0_16_;
        auVar48 = local_158;
        pMVar12->data = (void *)local_178._0_8_;
        pMVar12->refcount = (int *)local_178._8_8_;
        pMVar12->elemsize = local_178._16_8_;
        pMVar12->packing = local_178._24_4_;
        pMVar12->allocator = (Allocator *)local_158._0_8_;
        pMVar12->dims = local_158._8_4_;
        pMVar12->w = local_158._12_4_;
        pMVar12->h = local_148._0_4_;
        pMVar12->c = local_148._4_4_;
        local_148._8_8_ = auVar46._8_8_;
        pMVar12->cstep = local_148._8_8_;
        local_158 = auVar48;
        local_148._0_16_ = auVar46;
      }
LAB_00137756:
      iVar17 = 0;
    }
    else {
      copy_cut_border((Mat *)local_178,local_120,iVar17,iVar17,iVar34,iVar34,opt->blob_allocator,
                      opt->num_threads);
      iVar17 = -100;
      if ((pMVar12->data != (void *)0x0) && ((long)pMVar12->c * pMVar12->cstep != 0))
      goto LAB_00137756;
    }
    piVar18 = (int *)local_178._8_8_;
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      piVar18 = (int *)local_178._8_8_;
    }
  }
  if (piVar18 == (int *)0x0) {
    return iVar17;
  }
LAB_00137780:
  LOCK();
  *piVar18 = *piVar18 + -1;
  UNLOCK();
  if (*piVar18 == 0) {
    if ((Allocator *)local_158._0_8_ == (Allocator *)0x0) {
      if ((pointer)local_178._0_8_ != (pointer)0x0) {
        free((void *)local_178._0_8_);
      }
    }
    else {
      (**(code **)(*(long *)local_158._0_8_ + 0x18))();
    }
  }
  return iVar17;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = 1.f / (1.f + exp(-outptr[i]));
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}